

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

size_t __thiscall
kj::_::Delimited<kj::Repeat<kj::StringPtr>_>::size(Delimited<kj::Repeat<kj::StringPtr>_> *this)

{
  size_t sVar1;
  ArrayPtr<const_char> *e;
  ArrayPtr<const_char> *pAVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  
  ensureStringifiedInitialized(this);
  pAVar2 = (this->stringified).ptr;
  bVar4 = true;
  sVar1 = 0;
  for (lVar3 = (this->stringified).size_ << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    lVar5 = (this->delimiter).content.size_ - 1;
    if (bVar4) {
      lVar5 = 0;
    }
    sVar1 = sVar1 + pAVar2->size_ + lVar5;
    pAVar2 = pAVar2 + 1;
    bVar4 = false;
  }
  return sVar1;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }